

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O2

int __thiscall QStatusBar::insertWidget(QStatusBar *this,int index,QWidget *widget,int stretch)

{
  QStatusBarPrivate *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  char local_60 [24];
  char *local_48;
  SBItem local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    index = -1;
  }
  else {
    this_00 = *(QStatusBarPrivate **)&(this->super_QWidget).field_0x8;
    local_40.category = Normal;
    local_40.widget = widget;
    local_40.stretch = stretch;
    iVar2 = QStatusBarPrivate::indexToLastNonPermanentWidget(this_00);
    if (((index < 0) || ((ulong)(this_00->items).d.size < (ulong)(uint)index)) ||
       (iVar2 + 1U < (uint)index && -1 < iVar2)) {
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_48 = "default";
      QMessageLogger::warning
                (local_60,"QStatusBar::insertWidget: Index out of range (%d), appending widget",
                 (ulong)(uint)index);
      index = iVar2 + 1;
    }
    QList<QStatusBarPrivate::SBItem>::emplace<QStatusBarPrivate::SBItem_const&>
              (&this_00->items,(long)index,&local_40);
    if ((this_00->tempItem).d.size != 0) {
      QWidget::hide(widget);
    }
    reformat(this);
    bVar1 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar1) {
      QWidget::show(widget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return index;
  }
  __stack_chk_fail();
}

Assistant:

int QStatusBar::insertWidget(int index, QWidget *widget, int stretch)
{
    if (!widget)
        return -1;

    Q_D(QStatusBar);
    QStatusBarPrivate::SBItem item{widget, stretch, QStatusBarPrivate::Normal};

    int idx = d->indexToLastNonPermanentWidget();
    if (Q_UNLIKELY(index < 0 || index > d->items.size() || (idx >= 0 && index > idx + 1))) {
        qWarning("QStatusBar::insertWidget: Index out of range (%d), appending widget", index);
        index = idx + 1;
    }
    d->items.insert(index, item);

    if (!d->tempItem.isEmpty())
        widget->hide();

    reformat();
    if (!QWidgetPrivate::get(widget)->isExplicitlyHidden())
        widget->show();

    return index;
}